

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O0

void annError(char *msg,ANNerr level)

{
  ostream *poVar1;
  int in_ESI;
  char *in_RDI;
  
  if (in_ESI == 1) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"ANN: ERROR------->");
    poVar1 = std::operator<<(poVar1,in_RDI);
    std::operator<<(poVar1,"<-------------ERROR\n");
    exit(1);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"ANN: WARNING----->");
  poVar1 = std::operator<<(poVar1,in_RDI);
  std::operator<<(poVar1,"<-------------WARNING\n");
  return;
}

Assistant:

void annError(char const *msg, ANNerr level) {
    if (level == ANNabort) {
        std::cerr << "ANN: ERROR------->" << msg << "<-------------ERROR\n";
        exit(1);
    } else {
        std::cerr << "ANN: WARNING----->" << msg << "<-------------WARNING\n";
    }
}